

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

void __thiscall
QSortFilterProxyModel::setFilterCaseSensitivity(QSortFilterProxyModel *this,CaseSensitivity cs)

{
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
  *this_00;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  *this_01;
  QSortFilterProxyModelPrivate *this_02;
  parameter_type pVar1;
  PatternOptions PVar2;
  parameter_type pQVar3;
  long in_FS_OFFSET;
  QRegularExpression re;
  QRegularExpression local_58;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QSortFilterProxyModelPrivate **)(this + 8);
  this_00 = &this_02->filter_casesensitive;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper(this_00);
  this_01 = &this_02->filter_regularexpression;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(this_01);
  pVar1 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
          ::value(this_00);
  if (pVar1 != cs) {
    Qt::beginPropertyUpdateGroup();
    pQVar3 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
             ::value(this_01);
    PVar2 = QRegularExpression::patternOptions(pQVar3);
    (this_02->filter_casesensitive).super_QPropertyData<Qt::CaseSensitivity>.val = cs;
    local_50.r = -1;
    local_50.c = -1;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    QSortFilterProxyModelPrivate::filter_about_to_be_changed(this_02,&local_50);
    local_58.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
             ::value(this_01);
    QRegularExpression::QRegularExpression(&local_58,pQVar3);
    QRegularExpression::setPatternOptions
              (&local_58,
               (PatternOptions)
               ((uint)(cs == CaseInsensitive) |
               (uint)PVar2.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                     super_QFlagsStorage<QRegularExpression::PatternOption>.i & 0xfffffffe));
    QRegularExpression::operator=((QRegularExpression *)this_01,&local_58);
    local_50.r = -1;
    local_50.c = -1;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    QSortFilterProxyModelPrivate::filter_changed(this_02,(Directions)0x1,&local_50);
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
    ::notify(this_01);
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
    ::notify(this_00);
    QRegularExpression::~QRegularExpression(&local_58);
    Qt::endPropertyUpdateGroup();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModel::setFilterCaseSensitivity(Qt::CaseSensitivity cs)
{
    Q_D(QSortFilterProxyModel);
    d->filter_casesensitive.removeBindingUnlessInWrapper();
    d->filter_regularexpression.removeBindingUnlessInWrapper();
    if (cs == d->filter_casesensitive)
        return;

    const QScopedPropertyUpdateGroup guard;
    QRegularExpression::PatternOptions options =
            d->filter_regularexpression.value().patternOptions();
    options.setFlag(QRegularExpression::CaseInsensitiveOption, cs == Qt::CaseInsensitive);
    d->filter_casesensitive.setValueBypassingBindings(cs);

    d->filter_about_to_be_changed();
    QRegularExpression re = d->filter_regularexpression;
    re.setPatternOptions(options);
    d->filter_regularexpression.setValueBypassingBindings(re);
    d->filter_changed(Direction::Rows);
    d->filter_regularexpression.notify();
    d->filter_casesensitive.notify();
}